

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gzsetparams(gzFile file,int level,int strategy)

{
  int iVar1;
  z_streamp_conflict strm;
  gz_statep state;
  int strategy_local;
  int level_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -2;
  }
  else if ((*file == 0x79b1) && (*(int *)((long)file + 0x6c) == 0)) {
    if ((level == *(int *)((long)file + 0x58)) && (strategy == *(int *)((long)file + 0x5c))) {
      file_local._4_4_ = 0;
    }
    else {
      if (*(int *)((long)file + 0x68) != 0) {
        *(undefined4 *)((long)file + 0x68) = 0;
        iVar1 = gz_zero((gz_statep)file,*(long *)((long)file + 0x60));
        if (iVar1 == -1) {
          return -1;
        }
      }
      if (*(int *)((long)file + 0x18) != 0) {
        if ((*(int *)((long)file + 0x80) != 0) && (iVar1 = gz_comp((gz_statep)file,1), iVar1 == -1))
        {
          return *(int *)((long)file + 0x6c);
        }
        deflateParams((z_streamp)((long)file + 0x78),level,strategy);
      }
      *(int *)((long)file + 0x58) = level;
      *(int *)((long)file + 0x5c) = strategy;
      file_local._4_4_ = 0;
    }
  }
  else {
    file_local._4_4_ = -2;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzsetparams(gzFile file, int level, int strategy)
{
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* if no change is requested, then do nothing */
    if (level == state->level && strategy == state->strategy)
        return Z_OK;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* change compression parameters for subsequent input */
    if (state->size) {
        /* flush previous input with previous parameters before changing */
        if (strm->avail_in && gz_comp(state, Z_PARTIAL_FLUSH) == -1)
            return state->err;
        deflateParams(strm, level, strategy);
    }
    state->level = level;
    state->strategy = strategy;
    return Z_OK;
}